

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O3

void __thiscall
chrono::collision::cbtArcArcCollisionAlgorithm::processCollision
          (cbtArcArcCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  ulong uVar9;
  bool bVar10;
  char cVar11;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar12;
  cbtCollisionObject *pcVar13;
  cbtCollisionShape *pcVar14;
  cbtCollisionShape *pcVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  byte bVar28;
  int iVar29;
  long lVar30;
  cbtManifoldPoint *pt;
  cbtCollisionObjectWrapper *pcVar31;
  byte bVar32;
  byte bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [56];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  float fVar61;
  float fVar62;
  double __x;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [12];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_ZMM16 [64];
  float fVar77;
  undefined1 in_XMM23 [16];
  cbtVector3 cVar78;
  cbtVector3 normal_on_2;
  cbtVector3 pos2;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double local_b8;
  cbtVector3 local_a8;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  cbtVector3 local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 auVar55 [56];
  
  auVar36 = in_ZMM16._0_16_;
  this_00 = this->m_manifoldPtr;
  if (this_00 == (cbtPersistentManifold *)0x0) {
    return;
  }
  bVar10 = this->m_isSwapped;
  resultOut->m_manifoldPtr = this_00;
  iVar29 = this_00->m_cachedPoints;
  pcVar31 = body1;
  if (bVar10 != false) {
    pcVar31 = body0;
    body0 = body1;
  }
  if (0 < iVar29) {
    pt = this_00->m_pointCache;
    lVar30 = 0;
    do {
      cbtPersistentManifold::clearUserCache(this_00,pt);
      auVar36 = in_ZMM16._0_16_;
      iVar29 = this_00->m_cachedPoints;
      lVar30 = lVar30 + 1;
      pt = pt + 1;
    } while (lVar30 < iVar29);
  }
  if (iVar29 != 0 && gContactEndedCallback != (ContactEndedCallback)0x0) {
    local_a8.m_floats._0_8_ = this_00;
    (*gContactEndedCallback)((cbtPersistentManifold **)&local_a8);
  }
  this_00->m_cachedPoints = 0;
  pcVar12 = body0->m_collisionObject;
  pcVar13 = pcVar31->m_collisionObject;
  fVar41 = (pcVar12->m_worldTransform).m_basis.m_el[1].m_floats[2];
  fVar77 = (pcVar13->m_worldTransform).m_basis.m_el[1].m_floats[2];
  cVar1 = (pcVar12->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar2 = (pcVar13->m_worldTransform).m_basis.m_el[0].m_floats[2];
  cVar3 = (pcVar12->m_worldTransform).m_basis.m_el[2].m_floats[2];
  cVar4 = (pcVar13->m_worldTransform).m_basis.m_el[2].m_floats[2];
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar77)),ZEXT416((uint)cVar1),
                            ZEXT416((uint)cVar2));
  auVar34 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar3),ZEXT416((uint)cVar4));
  auVar35._8_4_ = 0x7fffffff;
  auVar35._0_8_ = 0x7fffffff7fffffff;
  auVar35._12_4_ = 0x7fffffff;
  auVar35 = vandps_avx512vl(auVar34,auVar35);
  if (auVar35._0_4_ < 0.99) {
    return;
  }
  fVar42 = (pcVar12->m_worldTransform).m_origin.m_floats[1];
  fVar74 = (pcVar13->m_worldTransform).m_origin.m_floats[1];
  fVar61 = (pcVar12->m_worldTransform).m_origin.m_floats[0];
  fVar62 = (pcVar13->m_worldTransform).m_origin.m_floats[0];
  fVar65 = (pcVar12->m_worldTransform).m_origin.m_floats[2];
  fVar66 = (pcVar13->m_worldTransform).m_origin.m_floats[2];
  pcVar14 = body0->m_shape;
  pcVar15 = pcVar31->m_shape;
  auVar35 = vfmadd231ss_fma(ZEXT416((uint)((fVar42 - fVar74) * fVar77)),ZEXT416((uint)cVar2),
                            ZEXT416((uint)(fVar61 - fVar62)));
  auVar35 = vfmadd231ss_avx512f(auVar35,ZEXT416((uint)cVar4),ZEXT416((uint)(fVar65 - fVar66)));
  auVar34._8_4_ = 0x7fffffff;
  auVar34._0_8_ = 0x7fffffff7fffffff;
  auVar34._12_4_ = 0x7fffffff;
  auVar35 = vandps_avx512vl(auVar35,auVar34);
  if (*(float *)&pcVar14[2].field_0x1c + *(float *)&pcVar15[2].field_0x1c < auVar35._0_4_) {
    return;
  }
  fVar5 = (float)pcVar14[2].m_shapeType;
  fVar6 = (pcVar12->m_worldTransform).m_basis.m_el[0].m_floats[1];
  uVar7 = *(uint *)((long)&pcVar14[2]._vptr_cbtCollisionShape + 4);
  fVar8 = (pcVar12->m_worldTransform).m_basis.m_el[0].m_floats[0];
  auVar35 = vxorps_avx512vl(auVar36,auVar36);
  auVar40 = ZEXT416((uint)(pcVar12->m_worldTransform).m_basis.m_el[1].m_floats[1]);
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar5),auVar40);
  auVar57 = ZEXT416((uint)(pcVar12->m_worldTransform).m_basis.m_el[2].m_floats[1]);
  auVar34 = vmulss_avx512f(ZEXT416((uint)fVar5),auVar57);
  auVar39 = ZEXT416((uint)(pcVar12->m_worldTransform).m_basis.m_el[1].m_floats[0]);
  auVar37 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar7),auVar39);
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6)),ZEXT416(uVar7),ZEXT416((uint)fVar8));
  auVar56 = ZEXT416((uint)(pcVar12->m_worldTransform).m_basis.m_el[2].m_floats[0]);
  auVar34 = vfmadd231ss_avx512f(auVar34,auVar56,ZEXT416(uVar7));
  auVar37 = vfmadd231ss_avx512f(auVar37,ZEXT416((uint)fVar41),auVar35);
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar1),auVar35);
  auVar34 = vfmadd231ss_avx512f(auVar34,ZEXT416((uint)cVar3),auVar35);
  auVar37 = vaddss_avx512f(auVar37,ZEXT416((uint)fVar42));
  fVar74 = auVar37._0_4_ - fVar74;
  fVar62 = (auVar36._0_4_ + fVar61) - fVar62;
  fVar66 = (auVar34._0_4_ + fVar65) - fVar66;
  uVar9 = *(ulong *)(pcVar13->m_worldTransform).m_basis.m_el[1].m_floats;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar9;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(pcVar13->m_worldTransform).m_basis.m_el[2].m_floats;
  auVar36 = vfmadd213ss_fma(ZEXT416((uint)cVar2),ZEXT416((uint)fVar62),
                            ZEXT416((uint)(fVar77 * fVar74)));
  auVar71._4_4_ = fVar62;
  auVar71._0_4_ = fVar62;
  auVar71._8_4_ = fVar62;
  auVar71._12_4_ = fVar62;
  auVar36 = vfmadd213ss_avx512f(ZEXT416((uint)cVar4),ZEXT416((uint)fVar66),auVar36);
  auVar34 = vmulss_avx512f(ZEXT416((uint)fVar6),auVar35);
  fVar77 = auVar36._0_4_;
  auVar38 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar8 + auVar34._0_4_)),auVar35,ZEXT416((uint)cVar1))
  ;
  auVar36 = vmulss_avx512f(auVar40,auVar35);
  auVar36 = vaddss_avx512f(auVar39,auVar36);
  auVar39 = vfmadd231ss_avx512f(auVar36,auVar35,ZEXT416((uint)fVar41));
  auVar36 = vmulss_avx512f(auVar57,auVar35);
  auVar36 = vaddss_avx512f(auVar56,auVar36);
  auVar56._0_4_ = (float)uVar9 * fVar74;
  auVar56._4_4_ = (float)(uVar9 >> 0x20) * fVar74;
  auVar56._8_4_ = fVar74 * 0.0;
  auVar56._12_4_ = fVar74 * 0.0;
  auVar40 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar3),auVar35);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(pcVar13->m_worldTransform).m_basis.m_el[0].m_floats;
  auVar36 = vfmadd213ps_fma(auVar71,auVar37,auVar56);
  auVar57._4_4_ = fVar66;
  auVar57._0_4_ = fVar66;
  auVar57._8_4_ = fVar66;
  auVar57._12_4_ = fVar66;
  auVar34 = vfmadd213ps_fma(auVar57,auVar76,auVar36);
  auVar36 = vmovshdup_avx(auVar75);
  auVar35 = vmovshdup_avx(auVar37);
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar9 * auVar39._0_4_)),auVar37,auVar38);
  auVar35 = vfmadd213ss_fma(auVar35,auVar38,ZEXT416((uint)(auVar36._0_4_ * auVar39._0_4_)));
  auVar36 = vmovshdup_avx(auVar76);
  auVar37 = vfmadd231ss_fma(auVar37,auVar76,auVar40);
  auVar36 = vfmadd213ss_fma(auVar36,auVar40,auVar35);
  fVar41 = atan2f(auVar36._0_4_,auVar37._0_4_);
  uVar9 = *(ulong *)((long)&pcVar15[2]._vptr_cbtCollisionShape + 4);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar9;
  auVar73 = (undefined1  [12])0x0;
  auVar35 = vsubps_avx(auVar34,auVar38);
  auVar36 = vmovshdup_avx(auVar35);
  fVar42 = auVar36._0_4_;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * fVar42)),auVar35,auVar35);
  auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
  auVar36 = vsqrtss_avx(auVar36,auVar36);
  fVar74 = auVar36._0_4_;
  if (fVar74 < 1e-08) {
    return;
  }
  auVar36 = vcvtss2sd_avx512f(in_XMM23,ZEXT416(*(uint *)&pcVar14[2].m_userPointer));
  local_98 = auVar36._0_8_;
  local_88 = (double)CONCAT44(local_88._4_4_,fVar41);
  auVar36 = vcvtss2sd_avx512f(in_XMM23,ZEXT416(*(uint *)((long)&pcVar14[2].m_userPointer + 4)));
  local_68 = auVar36._0_8_;
  auVar36 = vcvtss2sd_avx512f(in_XMM23,ZEXT416(*(uint *)&pcVar15[2].m_userPointer));
  local_78 = auVar36._0_8_;
  auVar36 = vcvtss2sd_avx512f(in_XMM23,ZEXT416(*(uint *)((long)&pcVar15[2].m_userPointer + 4)));
  fVar61 = 1.0 / fVar74;
  fVar77 = fVar77 * fVar61;
  fVar62 = auVar35._0_4_ * fVar61;
  fVar65 = auVar35._4_4_ * fVar61;
  fVar66 = auVar35._8_4_ * fVar61;
  fVar61 = auVar35._12_4_ * fVar61;
  fVar41 = atan2f(fVar42,auVar35._0_4_);
  cVar11 = (char)pcVar15[2].m_userIndex;
  dVar43 = (double)fVar41;
  if ((char)pcVar14[2].m_userIndex == '\0') {
    local_f8._0_4_ = (undefined4)uVar9;
    local_f8._4_4_ = (undefined4)(uVar9 >> 0x20);
    dVar44 = 0.0;
    local_b8 = 0.0;
    __x = 0.0;
    if (cVar11 == '\0') {
      fVar41 = *(float *)&pcVar15[2].field_0xc;
      auVar39._4_4_ = fVar65;
      auVar39._0_4_ = fVar62;
      auVar39._8_4_ = fVar66;
      auVar39._12_4_ = fVar61;
      auVar73 = SUB1612(ZEXT816(0) << 0x40,4);
      auVar40._4_12_ = ZEXT812(0) << 0x20;
      auVar40._0_4_ = fVar77;
      local_60.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar39,auVar40);
      auVar68._0_4_ = (float)local_f8._0_4_ + fVar62 * fVar41;
      auVar68._4_4_ = (float)local_f8._4_4_ + fVar65 * fVar41;
      auVar68._8_4_ = fVar66 * fVar41 + 0.0;
      auVar68._12_4_ = fVar61 * fVar41 + 0.0;
      local_a8.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar68,ZEXT416((uint)(fVar77 * fVar41 + 0.0)),0x28);
      dVar44 = dVar43 + 3.141592653589793;
      local_b8 = (double)((fVar74 - *(float *)&pcVar14[2].field_0xc) - fVar41);
      __x = dVar43;
    }
    if ((char)pcVar15[2].m_userIndex == '\x01') {
      fVar41 = *(float *)&pcVar15[2].field_0xc;
      if (*(float *)&pcVar14[2].field_0xc <= fVar41) {
        auVar69._0_4_ = (float)local_f8._0_4_ + fVar62 * fVar41;
        auVar69._4_4_ = (float)local_f8._4_4_ + fVar65 * fVar41;
        auVar69._8_4_ = fVar66 * fVar41 + 0.0;
        auVar69._12_4_ = fVar61 * fVar41 + 0.0;
        local_a8.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar69,ZEXT416((uint)(fVar77 * fVar41 + 0.0)),0x28);
        auVar70._0_8_ = CONCAT44(fVar65,fVar62) ^ 0x8000000080000000;
        auVar70._8_4_ = -fVar66;
        auVar70._12_4_ = -fVar61;
        auVar72._0_8_ = (ulong)(uint)fVar77 ^ 0x8000000080000000;
        auVar72._8_4_ = 0x80000000;
        auVar72._12_4_ = 0x80000000;
        auVar73 = auVar72._4_12_;
        local_60.m_floats = (cbtScalar  [4])vinsertps_avx(auVar70,auVar72,0x28);
        local_b8 = (double)((-fVar74 - *(float *)&pcVar14[2].field_0xc) + fVar41);
        dVar44 = dVar43;
        __x = dVar43;
        goto LAB_007ec1bf;
      }
    }
    if (cVar11 != '\0') {
      return;
    }
  }
  else {
    if (cVar11 != '\0') {
      return;
    }
    fVar41 = *(float *)&pcVar15[2].field_0xc;
    if (*(float *)&pcVar14[2].field_0xc < fVar41) {
      return;
    }
    auVar63._0_4_ = fVar62 * fVar41;
    auVar63._4_4_ = fVar65 * fVar41;
    auVar63._8_4_ = fVar66 * fVar41;
    auVar63._12_4_ = fVar61 * fVar41;
    auVar35 = vsubps_avx(auVar38,auVar63);
    auVar73 = SUB6412(ZEXT864(0),0);
    local_b8 = (double)((*(float *)&pcVar14[2].field_0xc - fVar74) - fVar41);
    local_a8.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar35,ZEXT416((uint)(0.0 - fVar77 * fVar41)),0x28);
    auVar67._0_8_ = CONCAT44(fVar65,fVar62) ^ 0x8000000080000000;
    auVar67._8_4_ = -fVar66;
    auVar67._12_4_ = -fVar61;
    auVar64._0_8_ = (ulong)(uint)fVar77 ^ 0x8000000080000000;
    auVar64._8_4_ = 0x80000000;
    auVar64._12_4_ = 0x80000000;
    local_60.m_floats = (cbtScalar  [4])vinsertps_avx(auVar67,auVar64,0x28);
    dVar44 = dVar43 + 3.141592653589793;
    __x = dVar43 + 3.141592653589793;
  }
LAB_007ec1bf:
  auVar35 = vcvtss2sd_avx512f(in_XMM23,ZEXT416(local_88._0_4_));
  dVar43 = auVar35._0_8_ + local_68;
  auVar46._0_8_ = fmod(auVar35._0_8_ + local_98,6.283185307179586);
  auVar46._8_56_ = extraout_var;
  uVar17 = vcmpsd_avx512f(auVar46._0_16_,ZEXT816(0) << 0x40,1);
  bVar10 = (bool)((byte)uVar17 & 1);
  auVar47._0_8_ = fmod(dVar43,6.283185307179586);
  auVar47._8_56_ = extraout_var_00;
  uVar17 = vcmpsd_avx512f(auVar47._0_16_,ZEXT816(0),1);
  bVar18 = (bool)((byte)uVar17 & 1);
  auVar48._0_8_ = fmod(local_78,6.283185307179586);
  auVar48._8_56_ = extraout_var_01;
  uVar17 = vcmpsd_avx512f(auVar48._0_16_,ZEXT816(0),1);
  bVar19 = (bool)((byte)uVar17 & 1);
  local_78 = (double)((ulong)bVar19 * (long)(auVar48._0_8_ + 6.283185307179586) +
                     (ulong)!bVar19 * (long)auVar48._0_8_);
  uStack_70 = extraout_var_01._0_8_;
  auVar49._0_8_ = fmod(auVar36._0_8_,6.283185307179586);
  auVar49._8_56_ = extraout_var_02;
  uVar17 = vcmpsd_avx512f(auVar49._0_16_,ZEXT816(0),1);
  bVar19 = (bool)((byte)uVar17 & 1);
  auVar50._0_8_ = fmod(dVar44,6.283185307179586);
  auVar50._8_56_ = extraout_var_03;
  uVar17 = vcmpsd_avx512f(auVar50._0_16_,ZEXT816(0),1);
  bVar20 = (bool)((byte)uVar17 & 1);
  local_88 = (double)((ulong)bVar20 * (long)(auVar50._0_8_ + 6.283185307179586) +
                     (ulong)!bVar20 * (long)auVar50._0_8_);
  uStack_80 = extraout_var_03._0_8_;
  auVar51._0_8_ = fmod(__x,6.283185307179586);
  auVar51._8_56_ = extraout_var_04;
  uVar17 = vcmpsd_avx512f(auVar51._0_16_,ZEXT816(0),1);
  bVar20 = (bool)((byte)uVar17 & 1);
  local_98 = (double)((ulong)bVar20 * (long)(auVar51._0_8_ + 6.283185307179586) +
                     (ulong)!bVar20 * (long)auVar51._0_8_);
  uStack_90 = extraout_var_04._0_8_;
  dVar43 = fmod((double)((ulong)bVar10 * (long)(auVar46._0_8_ + 6.283185307179586) +
                        (ulong)!bVar10 * (long)auVar46._0_8_),6.283185307179586);
  uStack_c0 = (undefined4)extraout_XMM0_Qb;
  uStack_bc = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
  local_e8._0_8_ =
       fmod((double)((ulong)bVar18 * (long)(auVar47._0_8_ + 6.283185307179586) +
                    (ulong)!bVar18 * (long)auVar47._0_8_),6.283185307179586);
  local_e8._8_8_ = extraout_XMM0_Qb_00;
  local_108._0_8_ = fmod(local_78,6.283185307179586);
  local_108._8_8_ = extraout_XMM0_Qb_01;
  local_f8 = (undefined1  [8])
             fmod((double)((ulong)bVar19 * (long)(auVar49._0_8_ + 6.283185307179586) +
                          (ulong)!bVar19 * (long)auVar49._0_8_),6.283185307179586);
  uStack_f0 = extraout_XMM0_Qb_02;
  dVar44 = fmod(local_88,6.283185307179586);
  auVar52._0_8_ = fmod(local_98,6.283185307179586);
  auVar52._8_56_ = extraout_var_05;
  if ((char)pcVar14[2].m_userIndex == '\x01') {
    auVar26._8_4_ = uStack_c0;
    auVar26._0_8_ = dVar43;
    auVar26._12_4_ = uStack_bc;
    if ((double)local_e8._0_8_ <= dVar43) {
      auVar24._8_8_ = extraout_XMM0_Qb_03;
      auVar24._0_8_ = dVar44;
      uVar17 = vcmppd_avx512vl(auVar24,local_e8,2);
      bVar32 = (byte)uVar17;
      uVar17 = vcmppd_avx512vl(auVar26,auVar24,2);
      bVar33 = (byte)uVar17;
LAB_007ec3fe:
      bVar32 = bVar33 & 3 | bVar32 & 3;
    }
    else {
      auVar22._8_8_ = extraout_XMM0_Qb_03;
      auVar22._0_8_ = dVar44;
      uVar17 = vcmppd_avx512vl(auVar26,auVar22,2);
      uVar16 = vcmppd_avx512vl(auVar22,local_e8,2);
      bVar32 = (byte)uVar17 & 3 & (byte)uVar16;
    }
  }
  else {
    auVar36._8_4_ = uStack_c0;
    auVar36._0_8_ = dVar43;
    auVar36._12_4_ = uStack_bc;
    if (dVar43 < (double)local_e8._0_8_) {
      auVar23._8_8_ = extraout_XMM0_Qb_03;
      auVar23._0_8_ = dVar44;
      uVar17 = vcmppd_avx512vl(auVar23,auVar36,2);
      bVar32 = (byte)uVar17;
      uVar17 = vcmppd_avx512vl(local_e8,auVar23,2);
      bVar33 = (byte)uVar17;
      goto LAB_007ec3fe;
    }
    auVar25._8_8_ = extraout_XMM0_Qb_03;
    auVar25._0_8_ = dVar44;
    uVar17 = vcmppd_avx512vl(local_e8,auVar25,2);
    uVar16 = vcmppd_avx512vl(auVar25,auVar36,2);
    bVar32 = (byte)uVar17 & 3 & (byte)uVar16;
  }
  auVar60 = ZEXT856(extraout_XMM0_Qb_01);
  auVar36 = auVar52._0_16_;
  if ((char)pcVar15[2].m_userIndex == '\x01') {
    if ((double)local_108._0_8_ < (double)local_f8) {
      uVar17 = vcmppd_avx512vl(local_108,auVar36,2);
      uVar16 = vcmppd_avx512vl(auVar36,_local_f8,2);
      bVar33 = (byte)uVar17 & 3 & (byte)uVar16;
      goto LAB_007ec47c;
    }
    uVar17 = vcmppd_avx512vl(auVar36,_local_f8,2);
    bVar33 = (byte)uVar17;
    uVar17 = vcmppd_avx512vl(local_108,auVar36,2);
    bVar28 = (byte)uVar17;
  }
  else {
    if ((double)local_f8 <= (double)local_108._0_8_) {
      uVar17 = vcmppd_avx512vl(_local_f8,auVar36,2);
      uVar16 = vcmppd_avx512vl(auVar36,local_108,2);
      bVar33 = (byte)uVar17 & 3 & (byte)uVar16;
      goto LAB_007ec47c;
    }
    uVar17 = vcmppd_avx512vl(auVar36,local_108,2);
    bVar33 = (byte)uVar17;
    uVar17 = vcmppd_avx512vl(_local_f8,auVar36,2);
    bVar28 = (byte)uVar17;
  }
  bVar33 = bVar28 & 3 | bVar33 & 3;
LAB_007ec47c:
  if ((bVar32 & bVar33 & 1) != 0) {
    auVar55 = extraout_var_05;
    cVar78 = cbtTransform::operator*(&pcVar13->m_worldTransform,&local_a8);
    auVar58._0_8_ = cVar78.m_floats._8_8_;
    auVar58._8_56_ = auVar60;
    auVar53._0_8_ = cVar78.m_floats._0_8_;
    auVar53._8_56_ = auVar55;
    local_40 = vunpcklpd_avx(auVar53._0_16_,auVar58._0_16_);
    auVar55 = ZEXT856(local_40._8_8_);
    cVar78 = ::operator*(&(pcVar13->m_worldTransform).m_basis,&local_60);
    auVar59._0_8_ = cVar78.m_floats._8_8_;
    auVar59._8_56_ = auVar60;
    auVar54._0_8_ = cVar78.m_floats._0_8_;
    auVar54._8_56_ = auVar55;
    local_50 = vunpcklpd_avx(auVar54._0_16_,auVar59._0_16_);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_b8;
    auVar21._8_4_ = 0xffffffff;
    auVar21._0_8_ = 0x7fffffffffffffff;
    auVar21._12_4_ = 0x7fffffff;
    auVar36 = vandpd_avx512vl(auVar27,auVar21);
    fVar77 = auVar36._0_4_;
    (*pcVar14->_vptr_cbtCollisionShape[0xc])(pcVar14);
    fVar41 = fVar77;
    (*pcVar15->_vptr_cbtCollisionShape[0xc])(pcVar15);
    local_108._0_8_ = auVar36._0_8_;
    if ((double)local_108._0_8_ <= (double)(fVar41 + fVar77)) {
      auVar45._0_4_ = (float)local_b8;
      auVar45._4_12_ = auVar73;
      (*(resultOut->super_Result)._vptr_Result[4])(auVar45._0_8_,resultOut,local_50,local_40);
      cbtManifoldResult::refreshContactPoints(resultOut);
    }
  }
  return;
}

Assistant:

void cbtArcArcCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                   const cbtCollisionObjectWrapper* body1,
                                                   const cbtDispatcherInfo& dispatchInfo,
                                                   cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* arcObj1Wrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* arcObj2Wrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    // only 1 contact per pair, avoid persistence
    resultOut->getPersistentManifold()->clearManifold();

    const cbt2DarcShape* arc1 = (cbt2DarcShape*)arcObj1Wrap->getCollisionShape();
    const cbt2DarcShape* arc2 = (cbt2DarcShape*)arcObj2Wrap->getCollisionShape();

    const cbtTransform& m44Tarc1 = arcObj1Wrap->getCollisionObject()->getWorldTransform();
    const cbtTransform& m44Tarc2 = arcObj2Wrap->getCollisionObject()->getWorldTransform();

    // Shapes on two planes that are not so parallel? no collisions!
    cbtVector3 Zarc1 = m44Tarc1.getBasis().getColumn(2);
    cbtVector3 Zarc2 = m44Tarc2.getBasis().getColumn(2);
    if (fabs(Zarc1.dot(Zarc2)) < 0.99)  //***TODO*** threshold as setting
        return;

    // Shapes on two planes that are too far? no collisions!
    cbtVector3 diff = m44Tarc2.invXform(m44Tarc1.getOrigin());
    if (fabs(diff.getZ()) > (arc1->get_zthickness() + arc2->get_zthickness()))
        return;

    // vectors and angles of arc 1 in arc 2 csys:
    cbtVector3 local_arc1_center = m44Tarc2.invXform(m44Tarc1 * cbtVector3(arc1->get_X(), arc1->get_Y(), 0));
    cbtVector3 local_arc1_X = m44Tarc2.getBasis().transpose() * (m44Tarc1.getBasis() * cbtVector3(1, 0, 0));
    double local_arc1_rot = atan2(local_arc1_X.getY(), local_arc1_X.getX());
    double arc1_angle1 = local_arc1_rot + arc1->get_angle1();
    double arc1_angle2 = local_arc1_rot + arc1->get_angle2();

    cbtVector3 local_arc2_center = cbtVector3(arc2->get_X(), arc2->get_Y(), 0);
    double arc2_angle1 = arc2->get_angle1();
    double arc2_angle2 = arc2->get_angle2();

    cbtVector3 local_C1C2 = local_arc1_center - local_arc2_center;
    auto len = local_C1C2.length();
    if (len < 1e-8)
        return;
    cbtVector3 local_D12 = local_C1C2 / len;

    cbtVector3 local_P1;
    cbtVector3 local_P2;
    cbtVector3 local_N2;
    double dist = 0;
    bool paired = false;
    double alpha = atan2(local_C1C2.getY(), local_C1C2.getX());
    double alpha1 = 0, alpha2 = 0;

    // convex-convex
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == false) {
        local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
        local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
        local_N2 = local_D12;
        dist = local_C1C2.length() - arc1->get_radius() - arc2->get_radius();
        alpha1 = alpha + CH_C_PI;
        alpha2 = alpha;
        paired = true;
    }
    // convex-concave
    if (arc1->get_counterclock() == false && arc2->get_counterclock() == true)
        if (arc1->get_radius() <= arc2->get_radius()) {
            local_P1 = local_arc1_center + local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center + local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() - arc1->get_radius() + arc2->get_radius();
            alpha1 = alpha;
            alpha2 = alpha;
            paired = true;
        }
    // concave-convex
    if (arc1->get_counterclock() == true && arc2->get_counterclock() == false)
        if (arc1->get_radius() >= arc2->get_radius()) {
            local_P1 = local_arc1_center - local_D12 * arc1->get_radius();
            local_P2 = local_arc2_center - local_D12 * arc2->get_radius();
            local_N2 = -local_D12;
            dist = -local_C1C2.length() + arc1->get_radius() - arc2->get_radius();
            alpha1 = alpha + CH_C_PI;
            alpha2 = alpha + CH_C_PI;
            paired = true;
        }

    if (!paired)
        return;

    // Discard points out of min-max angles

    // to always positive angles:
    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    if (arc1_angle1 < 0)
        arc1_angle1 += CH_C_2PI;
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    if (arc1_angle2 < 0)
        arc1_angle2 += CH_C_2PI;
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    if (arc2_angle1 < 0)
        arc2_angle1 += CH_C_2PI;
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    if (arc2_angle2 < 0)
        arc2_angle2 += CH_C_2PI;
    alpha1 = fmod(alpha1, CH_C_2PI);
    if (alpha1 < 0)
        alpha1 += CH_C_2PI;
    alpha2 = fmod(alpha2, CH_C_2PI);
    if (alpha2 < 0)
        alpha2 += CH_C_2PI;

    arc1_angle1 = fmod(arc1_angle1, CH_C_2PI);
    arc1_angle2 = fmod(arc1_angle2, CH_C_2PI);
    arc2_angle1 = fmod(arc2_angle1, CH_C_2PI);
    arc2_angle2 = fmod(arc2_angle2, CH_C_2PI);
    alpha1 = fmod(alpha1, CH_C_2PI);
    alpha2 = fmod(alpha2, CH_C_2PI);

    bool inangle1 = false;
    bool inangle2 = false;

    if (arc1->get_counterclock() == true) {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle1 && alpha1 <= arc1_angle2)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle1 || alpha1 <= arc1_angle2)
                inangle1 = true;
        }
    } else {
        if (arc1_angle1 < arc1_angle2) {
            if (alpha1 >= arc1_angle2 || alpha1 <= arc1_angle1)
                inangle1 = true;
        } else {
            if (alpha1 >= arc1_angle2 && alpha1 <= arc1_angle1)
                inangle1 = true;
        }
    }

    if (arc2->get_counterclock() == true) {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle1 && alpha2 <= arc2_angle2)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle1 || alpha2 <= arc2_angle2)
                inangle2 = true;
        }
    } else {
        if (arc2_angle1 < arc2_angle2) {
            if (alpha2 >= arc2_angle2 || alpha2 <= arc2_angle1)
                inangle2 = true;
        } else {
            if (alpha2 >= arc2_angle2 && alpha2 <= arc2_angle1)
                inangle2 = true;
        }
    }

    if (!(inangle1 && inangle2))
        return;

    // transform in absolute coords:
    cbtVector3 pos2 = m44Tarc2 * local_P2;
    cbtVector3 normal_on_2 = m44Tarc2.getBasis() * local_N2;

    // too far or too interpenetrate? discard.
    if (fabs(dist) > (arc1->getMargin() + arc2->getMargin()))
        return;

    /// report a contact.
    resultOut->addContactPoint(normal_on_2, pos2, (cbtScalar)dist);

    resultOut->refreshContactPoints();
}